

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O0

void InitNet(void)

{
  ushort uVar1;
  unsigned_long_long next_random;
  longlong b;
  longlong a;
  
  uVar1 = 1;
  posix_memalign(&syn0,0x80,vocab_size * layer1_size * 4);
  if (syn0 == (real *)0x0) {
    printf("Memory allocation failed\n");
    exit(1);
  }
  if (hs != 0) {
    posix_memalign(&syn1,0x80,vocab_size * layer1_size * 4);
    if (syn1 == (real *)0x0) {
      printf("Memory allocation failed\n");
      exit(1);
    }
    for (b = 0; b < vocab_size; b = b + 1) {
      for (next_random = 0; (long)next_random < layer1_size; next_random = next_random + 1) {
        syn1[b * layer1_size + next_random] = 0.0;
      }
    }
  }
  if (0 < negative) {
    posix_memalign(&syn1neg,0x80,vocab_size * layer1_size * 4);
    if (syn1neg == (real *)0x0) {
      printf("Memory allocation failed\n");
      exit(1);
    }
    for (b = 0; b < vocab_size; b = b + 1) {
      for (next_random = 0; (long)next_random < layer1_size; next_random = next_random + 1) {
        syn1neg[b * layer1_size + next_random] = 0.0;
      }
    }
  }
  for (b = 0; b < vocab_size; b = b + 1) {
    for (next_random = 0; (long)next_random < layer1_size; next_random = next_random + 1) {
      uVar1 = uVar1 * -0x1993 + 0xb;
      syn0[b * layer1_size + next_random] = ((float)uVar1 / 65536.0 - 0.5) / (float)layer1_size;
    }
  }
  CreateBinaryTree();
  return;
}

Assistant:

void InitNet() {
  long long a, b;
  unsigned long long next_random = 1;
  a = posix_memalign((void **)&syn0, 128, (long long)vocab_size * layer1_size * sizeof(real));
  if (syn0 == NULL) {printf("Memory allocation failed\n"); exit(1);}
  if (hs) {
    a = posix_memalign((void **)&syn1, 128, (long long)vocab_size * layer1_size * sizeof(real));
    if (syn1 == NULL) {printf("Memory allocation failed\n"); exit(1);}
    for (a = 0; a < vocab_size; a++) for (b = 0; b < layer1_size; b++)
     syn1[a * layer1_size + b] = 0;
  }
  if (negative>0) {
    a = posix_memalign((void **)&syn1neg, 128, (long long)vocab_size * layer1_size * sizeof(real));
    if (syn1neg == NULL) {printf("Memory allocation failed\n"); exit(1);}
    for (a = 0; a < vocab_size; a++) for (b = 0; b < layer1_size; b++)
     syn1neg[a * layer1_size + b] = 0;
  }
  for (a = 0; a < vocab_size; a++) for (b = 0; b < layer1_size; b++) {
    next_random = next_random * (unsigned long long)25214903917 + 11;
    syn0[a * layer1_size + b] = (((next_random & 0xFFFF) / (real)65536) - 0.5) / layer1_size;
  }
  CreateBinaryTree();
}